

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  int iVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1c;
  uint uStack_18;
  component_t l;
  color_quad<unsigned_char,_int> c;
  uint x;
  uint y;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  for (c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                    )0x0; (uint)c.field_0 < this->m_height;
      c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)((int)c.field_0 + 1)
      ) {
    for (uStack_18 = 0; uStack_18 < this->m_width; uStack_18 = uStack_18 + 1) {
      pcVar2 = operator()(this,uStack_18,(uint)c.field_0);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&local_1c.field_0,pcVar2);
      iVar1 = color_quad<unsigned_char,_int>::get_luma
                        ((color_quad<unsigned_char,_int> *)&local_1c.field_0);
      local_1c.field_0.r = (uchar)iVar1;
      local_1c.field_0.g = local_1c.field_0.r;
      local_1c.field_0.b = local_1c.field_0.r;
      pcVar2 = operator()(this,uStack_18,(uint)c.field_0);
      color_quad<unsigned_char,_int>::operator=
                (pcVar2,(color_quad<unsigned_char,_int> *)&local_1c.field_0);
    }
  }
  set_grayscale(this,true);
  return;
}

Assistant:

void convert_to_grayscale()
        {
            for (uint y = 0; y < m_height; y++)
            {
                for (uint x = 0; x < m_width; x++)
                {
                    color_type c((*this)(x, y));
                    typename color_type::component_t l = static_cast<typename color_type::component_t>(c.get_luma());
                    c.r = l;
                    c.g = l;
                    c.b = l;
                    (*this)(x, y) = c;
                }
            }

            set_grayscale(true);
        }